

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_compression_type.cpp
# Opt level: O0

bool duckdb::IsFileCompressed(string *path,FileCompressionType type)

{
  bool bVar1;
  string *in_RDI;
  size_t question_mark_pos;
  string extension;
  string *suffix;
  string local_b8 [8];
  string *in_stack_ffffffffffffff50;
  string *in_stack_ffffffffffffff58;
  allocator<char> local_91;
  string local_90 [15];
  undefined1 in_stack_ffffffffffffff7f;
  string local_60 [32];
  undefined8 local_40;
  string local_38 [55];
  byte local_1;
  
  CompressionExtensionFromType_abi_cxx11_(in_stack_ffffffffffffff7f);
  local_40 = 0xffffffffffffffff;
  ::std::__cxx11::string::string(local_60,(string *)in_RDI);
  suffix = (string *)&local_91;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_90,"\\\\?\\",(allocator *)suffix);
  bVar1 = StringUtil::StartsWith(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  ::std::__cxx11::string::~string(local_90);
  ::std::allocator<char>::~allocator(&local_91);
  ::std::__cxx11::string::~string(local_60);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    local_40 = ::std::__cxx11::string::find((char)in_RDI,0x3f);
  }
  ::std::__cxx11::string::substr((ulong)local_b8,(ulong)in_RDI);
  ::std::__cxx11::string::operator=((string *)in_RDI,local_b8);
  ::std::__cxx11::string::~string(local_b8);
  local_1 = StringUtil::EndsWith(in_RDI,suffix);
  ::std::__cxx11::string::~string(local_38);
  return (bool)(local_1 & 1);
}

Assistant:

bool IsFileCompressed(string path, FileCompressionType type) {
	auto extension = CompressionExtensionFromType(type);
	std::size_t question_mark_pos = std::string::npos;
	if (!StringUtil::StartsWith(path, "\\\\?\\")) {
		question_mark_pos = path.find('?');
	}
	path = path.substr(0, question_mark_pos);
	if (StringUtil::EndsWith(path, extension)) {
		return true;
	}
	return false;
}